

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageHandler.cpp
# Opt level: O0

int __thiscall ImageHandler::preProcess(ImageHandler *this,string *inFile,string *targetName)

{
  FILE *__stream;
  char *pcVar1;
  ulong uVar2;
  undefined8 uVar3;
  string *in_RDX;
  long in_RDI;
  allocator local_a1;
  string local_a0 [32];
  string local_80 [96];
  string *local_20;
  int local_4;
  
  local_20 = in_RDX;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,pcVar1,&local_a1);
  cv::imread(local_80,(int)local_a0);
  cv::Mat::operator=((Mat *)(in_RDI + 0x38),(Mat *)local_80);
  cv::Mat::~Mat((Mat *)local_80);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  uVar2 = cv::Mat::empty();
  __stream = _stderr;
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::operator=((string *)(in_RDI + 0x98),local_20);
    local_4 = 0;
  }
  else {
    uVar3 = std::__cxx11::string::c_str();
    fprintf(__stream,"cv::imread %s failed\n",uVar3);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int ImageHandler::preProcess(const std::string &inFile, const std::string &targetName) 
{
    m_img = cv::imread(inFile.c_str(), 1);
    if (m_img.empty()) 
    {
        fprintf(stderr, "cv::imread %s failed\n", inFile.c_str());
        return -1;
    }

    m_targetName = targetName;
    return 0;
}